

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

Memory __thiscall
google::protobuf::internal::SerialArena::Free<google::protobuf::internal::GetDeallocator>
          (SerialArena *this,GetDeallocator deallocator)

{
  Block *pBVar1;
  Block *pBVar2;
  Memory MVar3;
  Memory mem;
  GetDeallocator local_20;
  
  local_20.space_allocated_ = deallocator.space_allocated_;
  local_20.dealloc_ = deallocator.dealloc_;
  pBVar2 = this->head_;
  while( true ) {
    pBVar1 = pBVar2->next;
    if (pBVar1 == (Block *)0x0) break;
    mem.size = pBVar2->size;
    mem.ptr = pBVar2;
    GetDeallocator::operator()(&local_20,mem);
    pBVar2 = pBVar1;
  }
  MVar3.size = pBVar2->size;
  MVar3.ptr = pBVar2;
  return MVar3;
}

Assistant:

SerialArena::Memory SerialArena::Free(Deallocator deallocator) {
  Block* b = head_;
  Memory mem = {b, b->size};
  while (b->next) {
    b = b->next;  // We must first advance before deleting this block
    deallocator(mem);
    mem = {b, b->size};
  }
  return mem;
}